

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O0

int __thiscall
CumulativeCalProp::getStartTimeForEndTime(CumulativeCalProp *this,int i,int end,int duration)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int workDays;
  int start;
  int cal_idx;
  undefined4 local_1c;
  
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),in_ESI);
  iVar2 = *piVar4 + -1;
  local_1c = in_EDX - in_ECX;
  if (*(int *)(in_RDI + 0xa8) <= local_1c) {
    do {
      iVar3 = *(int *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 8) + (long)local_1c * 4) -
              *(int *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 8) + (long)in_EDX * 4);
      local_1c = local_1c - (in_ECX - iVar3);
      bVar1 = false;
      if (iVar3 < in_ECX) {
        bVar1 = *(int *)(in_RDI + 0xa8) <= local_1c;
      }
    } while (bVar1);
  }
  if (local_1c < *(int *)(in_RDI + 0xa8)) {
    local_1c = (*(int *)(in_RDI + 0xa8) - in_ECX) +
               (*(int *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 8) +
                        (long)*(int *)(in_RDI + 0xa8) * 4) -
               *(int *)(*(long *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 8) + (long)in_EDX * 4));
  }
  return local_1c;
}

Assistant:

int getStartTimeForEndTime(const int i, const int end, const int duration) {
		const int cal_idx = taskCalendar[i] - 1;
		int start = end - duration;
		if (start >= minTime) {
			int workDays;
			do {
				workDays = workingPeriods[cal_idx][start] - workingPeriods[cal_idx][end];
				start -= duration - workDays;
			} while (workDays < duration && start >= minTime);
			assert(workDays == duration || start < minTime);
		}
		if (start < minTime) {
			start =
					minTime - duration + (workingPeriods[cal_idx][minTime] - workingPeriods[cal_idx][end]);
		}
		return start;
	}